

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [8],char **Args_1,
          char (*Args_2) [12],uint *Args_3,char *Args_4,uint *Args_5,char *Args_6,uint *Args_7,
          char (*Args_8) [36],uint *Args_9,char *Args_10,uint *Args_11,char *Args_12,uint *Args_13,
          char (*Args_14) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [8])this,(char **)Args,(char (*) [12])Args_1,(uint *)Args_2,(char *)Args_3,
             (uint *)Args_4,(char *)Args_5,(uint *)Args_6,(char (*) [36])Args_7,(uint *)Args_8,
             (char *)Args_9,(uint *)Args_10,(char *)Args_11,(uint *)Args_12,(char (*) [3])Args_13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}